

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
::_InternalParse(MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  undefined1 auVar3 [16];
  bool bVar4;
  string *psVar5;
  char *field_name;
  uint uVar6;
  ulong uVar7;
  int size;
  undefined8 *puVar8;
  byte *pbVar9;
  pointer data;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_int> pVar11;
  byte *local_38;
  undefined1 auVar2 [12];
  
  local_38 = (byte *)ptr;
  do {
    bVar4 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar4) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    uVar7 = (ulong)bVar1;
    pbVar9 = local_38 + 1;
    if ((char)bVar1 < '\0') {
      uVar6 = ((uint)bVar1 + (uint)*pbVar9 * 0x80) - 0x80;
      uVar7 = (ulong)uVar6;
      if (-1 < (char)*pbVar9) {
        pbVar9 = local_38 + 2;
        goto LAB_0022e506;
      }
      pVar10 = ReadTagFallback((char *)local_38,uVar6);
      auVar2 = pVar10._0_12_;
      local_38 = (byte *)pVar10.first;
      if (local_38 == (byte *)0x0) {
        return (char *)0x0;
      }
    }
    else {
LAB_0022e506:
      auVar3._8_8_ = uVar7;
      auVar3._0_8_ = pbVar9;
      auVar2 = auVar3._0_12_;
      local_38 = pbVar9;
    }
    uVar6 = auVar2._8_4_;
    if (uVar6 == 10) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar8 = (undefined8 *)(uVar7 & 0xfffffffffffffffc);
      if ((uVar7 & 1) != 0) {
        puVar8 = (undefined8 *)*puVar8;
      }
      psVar5 = ArenaStringPtr::Mutable_abi_cxx11_(&this->key_,puVar8);
      bVar1 = *local_38;
      uVar6 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar11 = ReadSizeFallback((char *)local_38,(uint)bVar1);
        uVar6 = pVar11.second;
        pbVar9 = (byte *)pVar11.first;
        if (pbVar9 != (byte *)0x0) goto LAB_0022e606;
        local_38 = (byte *)0x0;
      }
      else {
        pbVar9 = local_38 + 1;
LAB_0022e606:
        local_38 = (byte *)EpsCopyInputStream::ReadString
                                     (&ctx->super_EpsCopyInputStream,(char *)pbVar9,uVar6,psVar5);
      }
      data = (psVar5->_M_dataplus)._M_p;
      size = (int)psVar5->_M_string_length;
      field_name = "CoreML.Specification.Metadata.UserDefinedEntry.key";
LAB_0022e625:
      bVar4 = WireFormatLite::VerifyUtf8String(data,size,PARSE,field_name);
      if (!bVar4) {
        return (char *)0x0;
      }
    }
    else {
      if (uVar6 == 0x12) {
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
        puVar8 = (undefined8 *)(uVar7 & 0xfffffffffffffffc);
        if ((uVar7 & 1) != 0) {
          puVar8 = (undefined8 *)*puVar8;
        }
        psVar5 = ArenaStringPtr::Mutable_abi_cxx11_(&this->value_,puVar8);
        bVar1 = *local_38;
        uVar6 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          pVar11 = ReadSizeFallback((char *)local_38,(uint)bVar1);
          uVar6 = pVar11.second;
          pbVar9 = (byte *)pVar11.first;
          if (pbVar9 != (byte *)0x0) goto LAB_0022e5d3;
          local_38 = (byte *)0x0;
        }
        else {
          pbVar9 = local_38 + 1;
LAB_0022e5d3:
          local_38 = (byte *)EpsCopyInputStream::ReadString
                                       (&ctx->super_EpsCopyInputStream,(char *)pbVar9,uVar6,psVar5);
        }
        data = (psVar5->_M_dataplus)._M_p;
        size = (int)psVar5->_M_string_length;
        field_name = "CoreML.Specification.Metadata.UserDefinedEntry.value";
        goto LAB_0022e625;
      }
      if ((uVar6 == 0) || ((uVar6 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
        return auVar2._0_8_;
      }
      local_38 = (byte *)UnknownFieldParse(uVar6,(string *)0x0,auVar2._0_8_,ctx);
    }
    if (local_38 == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) final {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      if (tag == kKeyTag) {
        set_has_key();
        KeyMapEntryAccessorType* key = mutable_key();
        ptr = KeyTypeHandler::Read(ptr, ctx, key);
        if (!Derived::ValidateKey(key)) return nullptr;
      } else if (tag == kValueTag) {
        set_has_value();
        ValueMapEntryAccessorType* value = mutable_value();
        ptr = ValueTypeHandler::Read(ptr, ctx, value);
        if (!Derived::ValidateValue(value)) return nullptr;
      } else {
        if (tag == 0 || WireFormatLite::GetTagWireType(tag) ==
                            WireFormatLite::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        ptr = UnknownFieldParse(tag, static_cast<std::string*>(nullptr), ptr,
                                ctx);
      }
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
    return ptr;
  }